

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapePrism> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  mapped_type_conflict *pmVar7;
  ostream *poVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  _Base_ptr p_Var12;
  long lVar13;
  stringstream sout;
  long *local_1d8;
  long local_1c8 [2];
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_018ffb68;
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,&PTR_PTR_018fab08,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapePrism>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_018fa730;
  (this->fSideOrient).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 0;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  uVar2 = (copy->fSideOrient).super_TPZVec<int>.fNElements;
  if ((long)uVar2 < 6) {
    piVar5 = (this->fSideOrient).fExtAlloc;
    (this->fSideOrient).super_TPZVec<int>.fStore = piVar5;
    (this->fSideOrient).super_TPZVec<int>.fNElements = uVar2;
    (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
    if ((long)uVar2 < 1) goto LAB_010ecebd;
  }
  else {
    piVar5 = (int *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    (this->fSideOrient).super_TPZVec<int>.fStore = piVar5;
    (this->fSideOrient).super_TPZVec<int>.fNElements = uVar2;
    (this->fSideOrient).super_TPZVec<int>.fNAlloc = uVar2;
  }
  piVar3 = (copy->fSideOrient).super_TPZVec<int>.fStore;
  uVar11 = 0;
  do {
    piVar5[uVar11] = piVar3[uVar11];
    uVar11 = uVar11 + 1;
  } while (uVar2 != uVar11);
LAB_010ecebd:
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0188d770;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 6;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x24) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 5) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x2c) = 0xffffffff;
  this->fhdivfam = copy->fhdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder =
       (copy->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
       super_TPZInterpolationSpace.fPreferredOrder;
  p_Var1 = &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar13 = 0;
  while( true ) {
    iVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar4 <= lVar13) {
      return;
    }
    p_Var10 = (gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    iVar4 = (int)(copy->fConnectIndexes).super_TPZVec<long>.fStore[lVar13];
    if (p_Var10 == (_Base_ptr)0x0) break;
    lVar6 = (long)iVar4;
    p_Var12 = &p_Var1->_M_header;
    do {
      if (lVar6 <= (long)*(size_t *)(p_Var10 + 1)) {
        p_Var12 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[(long)*(size_t *)(p_Var10 + 1) < lVar6];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var12 == p_Var1) || (lVar6 < (long)*(size_t *)(p_Var12 + 1))) break;
    local_1b8[0] = lVar6;
    pmVar7 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcConMap,local_1b8);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar13] = (long)(int)*pmVar7;
    lVar13 = lVar13 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ERROR in : ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             "TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv(TPZCompMesh &, const TPZCompElHDiv<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapePrism]"
             ,0xc0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8," trying to clone the connect index: ",0x24);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8," wich is not in mapped connect indexes!",0x27);
  std::__cxx11::stringbuf::str();
  if (local_1d8 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
  }
  else {
    sVar9 = strlen((char *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_1d8,sVar9);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar13] = -1;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh,
									 const TPZCompElHDiv<TSHAPE> &copy,
									 std::map<int64_t,int64_t> & gl2lcConMap,
									 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
	int i;
	for(i=0;i<NConnects();i++)
	{
		int lcIdx = -1;
		int glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			this-> fConnectIndexes[i] = -1;
			return;
		}
		this-> fConnectIndexes[i] = lcIdx;
	}
}